

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

void slang::SVInt::divide
               (SVInt *lhs,uint32_t lhsWords,SVInt *rhs,uint32_t rhsWords,SVInt *quotient,
               SVInt *remainder)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *__s;
  uint *__s_00;
  uint *__s_01;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R9;
  bool bothSigned;
  uint64_t partial_dividend;
  int i_2;
  uint32_t rem;
  uint32_t divisor;
  uint32_t i_1;
  uint32_t i;
  uint32_t *r;
  uint32_t *q;
  uint32_t *v;
  uint32_t *u;
  TempBuffer<unsigned_int,_128UL> scratch;
  size_t totalWordsNeeded;
  uint32_t dividendWords;
  uint32_t extraWords;
  uint32_t divisorWords;
  size_t in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd34;
  undefined1 in_stack_fffffffffffffd35;
  undefined1 uVar4;
  undefined1 in_stack_fffffffffffffd36;
  undefined1 uVar5;
  undefined1 in_stack_fffffffffffffd37;
  undefined1 uVar6;
  uint *__s_02;
  uint *dest;
  TempBuffer<unsigned_int,_128UL> *this;
  ulong in_stack_fffffffffffffd58;
  uint32_t numWords;
  undefined1 in_stack_fffffffffffffd63;
  bitwidth_t in_stack_fffffffffffffd64;
  uint in_stack_fffffffffffffd68;
  uint in_stack_fffffffffffffd6c;
  uint32_t *in_stack_fffffffffffffda8;
  uint32_t *in_stack_fffffffffffffdb0;
  uint32_t *in_stack_fffffffffffffdb8;
  uint32_t *in_stack_fffffffffffffdc0;
  int local_38;
  uint local_34;
  
  uVar3 = in_ECX * 2;
  local_38 = in_ESI * 2 + in_ECX * -2;
  uVar2 = uVar3 + local_38;
  this = (TempBuffer<unsigned_int,_128UL> *)&stack0xfffffffffffffda8;
  TempBuffer<unsigned_int,_128UL>::TempBuffer
            ((TempBuffer<unsigned_int,_128UL> *)
             CONCAT17(in_stack_fffffffffffffd37,
                      CONCAT16(in_stack_fffffffffffffd36,
                               CONCAT15(in_stack_fffffffffffffd35,
                                        CONCAT14(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30
                                                )))),in_stack_fffffffffffffd28);
  __s = TempBuffer<unsigned_int,_128UL>::get(this);
  __s_00 = __s + (ulong)uVar2 + 1;
  __s_01 = __s_00 + uVar3;
  if (in_R9 == 0) {
    __s_02 = (uint *)0x0;
  }
  else {
    __s_02 = __s_01 + uVar2;
  }
  dest = __s_02;
  memset(__s,0,(ulong)(uVar2 + 1) << 2);
  splitWords((SVInt *)this,dest,
             CONCAT13(in_stack_fffffffffffffd37,
                      CONCAT12(in_stack_fffffffffffffd36,
                               CONCAT11(in_stack_fffffffffffffd35,in_stack_fffffffffffffd34))));
  memset(__s_00,0,(ulong)uVar3 << 2);
  splitWords((SVInt *)this,dest,
             CONCAT13(in_stack_fffffffffffffd37,
                      CONCAT12(in_stack_fffffffffffffd36,
                               CONCAT11(in_stack_fffffffffffffd35,in_stack_fffffffffffffd34))));
  memset(__s_01,0,(ulong)uVar2 << 2);
  if (in_R9 != 0) {
    memset(__s_02,0,(ulong)uVar3 << 2);
  }
  numWords = (uint32_t)(in_stack_fffffffffffffd58 >> 0x20);
  __s[uVar2] = 0;
  local_34 = uVar3;
  while( true ) {
    uVar6 = false;
    if (uVar3 != 0) {
      uVar6 = __s_00[uVar3 - 1] == 0;
    }
    if ((bool)uVar6 == false) break;
    local_34 = local_34 - 1;
    local_38 = local_38 + 1;
    uVar3 = uVar3 - 1;
  }
  while( true ) {
    uVar5 = false;
    if (uVar2 != 0) {
      uVar5 = __s[uVar2 - 1] == 0;
    }
    if ((bool)uVar5 == false) break;
    local_38 = local_38 + -1;
    uVar2 = uVar2 - 1;
  }
  if (local_34 == 1) {
    in_stack_fffffffffffffd6c = *__s_00;
    in_stack_fffffffffffffd68 = 0;
    in_stack_fffffffffffffd64 = local_34 + local_38;
    while( true ) {
      numWords = (uint32_t)(in_stack_fffffffffffffd58 >> 0x20);
      in_stack_fffffffffffffd64 = in_stack_fffffffffffffd64 - 1;
      if ((int)in_stack_fffffffffffffd64 < 0) break;
      uVar1 = __s[(int)in_stack_fffffffffffffd64];
      in_stack_fffffffffffffd58 = CONCAT44(in_stack_fffffffffffffd68,uVar1);
      if (in_stack_fffffffffffffd58 == 0) {
        __s_01[(int)in_stack_fffffffffffffd64] = 0;
        in_stack_fffffffffffffd68 = 0;
      }
      else if (in_stack_fffffffffffffd58 < in_stack_fffffffffffffd6c) {
        __s_01[(int)in_stack_fffffffffffffd64] = 0;
        in_stack_fffffffffffffd68 = uVar1;
      }
      else if (in_stack_fffffffffffffd58 == in_stack_fffffffffffffd6c) {
        __s_01[(int)in_stack_fffffffffffffd64] = 1;
        in_stack_fffffffffffffd68 = 0;
      }
      else {
        __s_01[(int)in_stack_fffffffffffffd64] =
             (uint)(in_stack_fffffffffffffd58 / in_stack_fffffffffffffd6c);
        in_stack_fffffffffffffd68 =
             uVar1 - __s_01[(int)in_stack_fffffffffffffd64] * in_stack_fffffffffffffd6c;
      }
    }
    if (__s_02 != (uint *)0x0) {
      *__s_02 = in_stack_fffffffffffffd68;
    }
  }
  else {
    knuthDiv(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
             in_stack_fffffffffffffda8,(uint32_t)((ulong)__s >> 0x20),(uint32_t)__s);
  }
  uVar4 = 0;
  if ((*(byte *)(in_RDI + 0xc) & 1) != 0) {
    uVar4 = *(undefined1 *)(in_RDX + 0xc);
  }
  buildDivideResult((SVInt *)CONCAT44(uVar3,uVar2),
                    (uint32_t *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                    in_stack_fffffffffffffd64,(bool)in_stack_fffffffffffffd63,numWords);
  buildDivideResult((SVInt *)CONCAT44(uVar3,uVar2),
                    (uint32_t *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                    in_stack_fffffffffffffd64,(bool)in_stack_fffffffffffffd63,numWords);
  TempBuffer<unsigned_int,_128UL>::~TempBuffer
            ((TempBuffer<unsigned_int,_128UL> *)
             CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(in_stack_fffffffffffffd34,
                                                                   in_stack_fffffffffffffd30)))));
  return;
}

Assistant:

void SVInt::divide(const SVInt& lhs, uint32_t lhsWords, const SVInt& rhs, uint32_t rhsWords,
                   SVInt* quotient, SVInt* remainder) {
    SLANG_ASSERT(lhsWords >= rhsWords);

    // The Knuth algorithm requires arrays of 32-bit words (because results of operations
    // need to fit natively into 64 bits). Allocate space for the backing memory, either on
    // the stack if it's small or on the heap if it's not.
    uint32_t divisorWords = rhsWords * 2;
    uint32_t extraWords = (lhsWords * 2) - divisorWords;
    uint32_t dividendWords = divisorWords + extraWords;

    size_t totalWordsNeeded = (remainder ? 4 : 3) * divisorWords + 2 * extraWords + 1;
    TempBuffer<uint32_t, 128> scratch(totalWordsNeeded);
    uint32_t* u = scratch.get();
    uint32_t* v = u + dividendWords + 1;
    uint32_t* q = v + divisorWords;
    uint32_t* r = remainder ? q + dividendWords : nullptr;

    // Initialize the dividend and divisor
    memset(u, 0, (dividendWords + 1) * sizeof(uint32_t));
    splitWords(lhs, u, lhsWords);

    memset(v, 0, divisorWords * sizeof(uint32_t));
    splitWords(rhs, v, rhsWords);

    // Initialize quotient and remainder
    memset(q, 0, dividendWords * sizeof(uint32_t));
    if (remainder)
        memset(r, 0, divisorWords * sizeof(uint32_t));

    // extra word for spill space in Knuth algorithm
    u[dividendWords] = 0;

    // Adjust sizes for division. The Knuth algorithm will fail if there
    // are empty words in the input.
    for (uint32_t i = divisorWords; i > 0 && v[i - 1] == 0; i--) {
        divisorWords--;
        extraWords++;
    }
    for (uint32_t i = dividendWords; i > 0 && u[i - 1] == 0; i--)
        extraWords--;

    // If we're left with only a single divisor word, Knuth won't work.
    // We can use a sequence of standard 64 bit divides for this.
    dividendWords = divisorWords + extraWords;
    if (divisorWords == 1) {
        uint32_t divisor = v[0];
        uint32_t rem = 0;
        for (int i = int(dividendWords - 1); i >= 0; i--) {
            uint64_t partial_dividend = uint64_t(rem) << 32 | u[i];
            if (partial_dividend == 0) {
                q[i] = 0;
                rem = 0;
            }
            else if (partial_dividend < divisor) {
                q[i] = 0;
                rem = (uint32_t)partial_dividend;
            }
            else if (partial_dividend == divisor) {
                q[i] = 1;
                rem = 0;
            }
            else {
                q[i] = (uint32_t)(partial_dividend / divisor);
                rem = (uint32_t)(partial_dividend - (q[i] * divisor));
            }
        }
        if (r)
            r[0] = rem;
    }
    else {
        // otherwise invoke Knuth
        knuthDiv(u, v, q, r, extraWords, divisorWords);
    }

    bool bothSigned = lhs.signFlag && rhs.signFlag;
    buildDivideResult(quotient, q, lhs.bitWidth, bothSigned, lhsWords);
    buildDivideResult(remainder, r, rhs.bitWidth, bothSigned, rhsWords);
}